

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompositionfunctions.cpp
# Opt level: O2

void comp_func_solid_SourceOver(uint *dest,int length,uint color,uint const_alpha)

{
  OptimalType OVar1;
  OptimalType c;
  ulong uVar2;
  ulong uVar3;
  
  if (const_alpha == 0xff) {
    if (0xfeffffff < color) {
      (*qt_memfill32)(dest,color,(long)length);
      return;
    }
  }
  else {
    color = Argb32OperationsC::multiplyAlpha8bit(color,(uint8_t)const_alpha);
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    OVar1 = Argb32OperationsC::multiplyAlpha(dest[uVar2],~(byte)(color >> 0x18));
    dest[uVar2] = OVar1 + color;
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_solid_SourceOver(uint *dest, int length, uint color, uint const_alpha)
{
    comp_func_solid_SourceOver_template<Argb32Operations>(dest, length, color, const_alpha);
}